

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

undefined8 __thiscall
OSTEI_HRR_Writer::HRRBraStepVar_(OSTEI_HRR_Writer *this,Doublet *d,string *ncart_ket,string *ketstr)

{
  int __c;
  Doublet *in_RDX;
  char *__s;
  undefined8 in_RDI;
  string arrname;
  Doublet *in_stack_ffffffffffffff08;
  Doublet *in_stack_ffffffffffffff10;
  allocator local_a9;
  string local_a8 [16];
  char (*in_stack_ffffffffffffff68) [4];
  int *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [9];
  string *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  Doublet *in_stack_ffffffffffffffc8;
  
  Doublet::Doublet(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  __s = &stack0xffffffffffffff78;
  ArrVarName(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Doublet::~Doublet((Doublet *)0x14b28e);
  Doublet::index(in_RDX,__s,__c);
  StringBuilder<char[5],std::__cxx11::string&,char_const(&)[2],int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return in_RDI;
}

Assistant:

std::string OSTEI_HRR_Writer::HRRBraStepVar_(const Doublet & d, const std::string & ncart_ket, 
                                             const std::string & ketstr) const
{
    std::string arrname = ArrVarName(d, ketstr);
    return StringBuilder("HRR_", arrname, "[", d.index(), " * ", ncart_ket, " + iket]"); 
}